

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::clara::detail::normaliseOpt(string *__return_storage_ptr__,string *optName)

{
  string *optName_local;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)optName);
  return __return_storage_ptr__;
}

Assistant:

inline auto normaliseOpt( std::string const &optName ) -> std::string {
#ifdef CATCH_PLATFORM_WINDOWS
        if( optName[0] == '/' )
            return "-" + optName.substr( 1 );
        else
#endif
            return optName;
    }